

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O0

void CoreML::KNNValidatorTests::addDataPoints(KNearestNeighborsClassifier *nnModel)

{
  allocator<float> *paVar1;
  initializer_list<std::vector<float,_std::allocator<float>_>_> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<float> __l_05;
  NearestNeighborsIndex *this;
  reference this_00;
  FloatVector *this_01;
  const_reference pvVar2;
  vector<float,_std::allocator<float>_> *local_2d0;
  ulong local_290;
  size_t j;
  value_type *sample;
  size_t i;
  NearestNeighborsIndex *nnIndex;
  size_t pointCount;
  vector<float,_std::allocator<float>_> *local_260;
  vector<float,_std::allocator<float>_> local_258;
  vector<float,_std::allocator<float>_> local_240;
  vector<float,_std::allocator<float>_> local_228;
  vector<float,_std::allocator<float>_> local_210;
  vector<float,_std::allocator<float>_> local_1f8;
  vector<float,_std::allocator<float>_> local_1e0;
  undefined1 local_1c8 [24];
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  points;
  float local_198 [4];
  iterator local_188;
  size_type local_180;
  undefined1 local_178 [8];
  vector<float,_std::allocator<float>_> point2b;
  float local_158 [4];
  iterator local_148;
  size_type local_140;
  undefined1 local_138 [8];
  vector<float,_std::allocator<float>_> point2;
  float local_118 [4];
  iterator local_108;
  size_type local_100;
  undefined1 local_f8 [8];
  vector<float,_std::allocator<float>_> point1b;
  float local_d8 [4];
  iterator local_c8;
  size_type local_c0;
  undefined1 local_b8 [8];
  vector<float,_std::allocator<float>_> point1;
  float local_98 [4];
  iterator local_88;
  size_type local_80;
  undefined1 local_78 [8];
  vector<float,_std::allocator<float>_> point0b;
  allocator<float> local_49;
  float local_48 [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<float,_std::allocator<float>_> point0;
  KNearestNeighborsClassifier *nnModel_local;
  
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  local_38 = local_48;
  local_30 = 4;
  point0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)nnModel;
  std::allocator<float>::allocator(&local_49);
  __l_05._M_len = local_30;
  __l_05._M_array = local_38;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_28,__l_05,&local_49);
  std::allocator<float>::~allocator(&local_49);
  local_98[0] = 0.0;
  local_98[1] = 0.1;
  local_98[2] = 0.0;
  local_98[3] = 0.0;
  local_88 = local_98;
  local_80 = 4;
  paVar1 = (allocator<float> *)
           ((long)&point1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(paVar1);
  __l_04._M_len = local_80;
  __l_04._M_array = local_88;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_78,__l_04,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&point1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_d8[0] = 1.0;
  local_d8[1] = 0.0;
  local_d8[2] = 0.0;
  local_d8[3] = 0.0;
  local_c8 = local_d8;
  local_c0 = 4;
  paVar1 = (allocator<float> *)
           ((long)&point1b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(paVar1);
  __l_03._M_len = local_c0;
  __l_03._M_array = local_c8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_b8,__l_03,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&point1b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_118[0] = 1.0;
  local_118[1] = 0.0;
  local_118[2] = 0.1;
  local_118[3] = 0.0;
  local_108 = local_118;
  local_100 = 4;
  paVar1 = (allocator<float> *)
           ((long)&point2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(paVar1);
  __l_02._M_len = local_100;
  __l_02._M_array = local_108;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_02,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&point2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_158[0] = 2.1;
  local_158[1] = 0.0;
  local_158[2] = 0.0;
  local_158[3] = 0.0;
  local_148 = local_158;
  local_140 = 4;
  paVar1 = (allocator<float> *)
           ((long)&point2b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(paVar1);
  __l_01._M_len = local_140;
  __l_01._M_array = local_148;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_138,__l_01,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&point2b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_198[0] = 2.1;
  local_198[1] = 0.0;
  local_198[2] = 0.0;
  local_198[3] = 0.1;
  local_188 = local_198;
  local_180 = 4;
  paVar1 = (allocator<float> *)
           ((long)&points.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(paVar1);
  __l_00._M_len = local_180;
  __l_00._M_array = local_188;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_178,__l_00,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&points.
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_260 = &local_258;
  std::vector<float,_std::allocator<float>_>::vector
            (local_260,(vector<float,_std::allocator<float>_> *)local_28);
  local_260 = &local_240;
  std::vector<float,_std::allocator<float>_>::vector
            (local_260,(vector<float,_std::allocator<float>_> *)local_b8);
  local_260 = &local_228;
  std::vector<float,_std::allocator<float>_>::vector
            (local_260,(vector<float,_std::allocator<float>_> *)local_138);
  local_260 = &local_210;
  std::vector<float,_std::allocator<float>_>::vector
            (local_260,(vector<float,_std::allocator<float>_> *)local_78);
  local_260 = &local_1f8;
  std::vector<float,_std::allocator<float>_>::vector
            (local_260,(vector<float,_std::allocator<float>_> *)local_f8);
  local_260 = &local_1e0;
  std::vector<float,_std::allocator<float>_>::vector
            (local_260,(vector<float,_std::allocator<float>_> *)local_178);
  local_1c8._0_8_ = &local_258;
  local_1c8._8_8_ = (pointer)0x6;
  std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)((long)&pointCount + 7));
  __l._M_len = local_1c8._8_8_;
  __l._M_array = (iterator)local_1c8._0_8_;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)(local_1c8 + 0x10),__l,
           (allocator<std::vector<float,_std::allocator<float>_>_> *)((long)&pointCount + 7));
  std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)((long)&pointCount + 7));
  local_2d0 = (vector<float,_std::allocator<float>_> *)local_1c8;
  do {
    local_2d0 = local_2d0 + -1;
    std::vector<float,_std::allocator<float>_>::~vector(local_2d0);
  } while (local_2d0 != &local_258);
  this = Specification::KNearestNeighborsClassifier::mutable_nearestneighborsindex
                   ((KNearestNeighborsClassifier *)
                    point0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  Specification::NearestNeighborsIndex::set_numberofdimensions(this,4);
  for (sample = (value_type *)0x0; sample < (value_type *)0x6;
      sample = (value_type *)
               ((long)&(sample->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1)) {
    Specification::NearestNeighborsIndex::add_floatsamples(this);
    this_00 = std::
              vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            *)(local_1c8 + 0x10),(size_type)sample);
    for (local_290 = 0; local_290 < 4; local_290 = local_290 + 1) {
      this_01 = Specification::NearestNeighborsIndex::mutable_floatsamples(this,(int)sample);
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](this_00,local_290);
      Specification::FloatVector::add_vector(this_01,*pvVar2);
    }
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)(local_1c8 + 0x10));
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_178);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_138);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_f8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_b8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_78);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_28);
  return;
}

Assistant:

void addDataPoints(Specification::KNearestNeighborsClassifier* nnModel) {

        std::vector<float> point0 = {0, 0, 0, 0};
        std::vector<float> point0b = {0, 0.1f, 0, 0};

        std::vector<float> point1 = {1, 0, 0, 0};
        std::vector<float> point1b = {1, 0, 0.1f, 0};

        std::vector<float> point2 = {2.1f, 0, 0, 0};
        std::vector<float> point2b = {2.1f, 0, 0, 0.1f};

        std::vector<std::vector<float>> points = {point0, point1, point2, point0b, point1b, point2b};
        size_t pointCount = 6;

        auto *nnIndex = nnModel->mutable_nearestneighborsindex();
        nnIndex->set_numberofdimensions(4);

        for (size_t i = 0; i < pointCount; i++) {
            nnIndex->add_floatsamples();
            const auto& sample = points[i];
            for (size_t j = 0; j < 4; j++) {
                nnIndex->mutable_floatsamples((int)i)->add_vector(sample[j]);
            }
        }

    }